

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O3

void __thiscall
LSL_RLEZ<UF>::PerformLabelingMem
          (LSL_RLEZ<UF> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  Mat *m;
  pointer puVar5;
  pointer puVar6;
  double dVar7;
  pointer puVar8;
  pointer piVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar10;
  uint uVar11;
  uint uVar12;
  int *piVar13;
  undefined1 (*pauVar14) [16];
  ulong uVar15;
  int *piVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  double dVar29;
  double dVar30;
  MemVector<int> ner;
  MemMat<int> ERA;
  MemMat<int> RLC;
  MemMat<int> ER;
  MemMat<int> labels;
  MemMat<int> img;
  MemVector<int> local_548;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_518;
  long *local_510;
  long local_508;
  long *local_500;
  long local_4f8;
  undefined4 local_4f0;
  Mat *local_4e8;
  undefined8 local_4e0;
  undefined1 local_4d8 [104];
  Mat local_470 [16];
  long local_460;
  long *local_428;
  Mat_<int> local_410;
  undefined1 local_3b0 [104];
  Mat local_348 [16];
  long local_338;
  long *local_300;
  undefined1 local_2e8 [104];
  Mat local_280 [16];
  long local_270;
  long *local_238;
  undefined1 local_220 [104];
  Mat local_1b8 [16];
  long local_1a8;
  long *local_170;
  undefined1 local_158 [104];
  Mat local_f0 [16];
  long local_e0;
  long *local_a8;
  Mat_<int> local_90;
  
  m = &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat;
  uVar3 = *(uint *)(m + 8);
  uVar15 = (ulong)uVar3;
  uVar4 = *(uint *)(m + 0xc);
  cv::Mat::Mat(&local_90.super_Mat);
  local_90._0_4_ = local_90._0_4_ & 0xfffff000 | 4;
  cv::Mat_<int>::operator=((Mat_<int> *)&local_90.super_Mat,m);
  MemMat<int>::MemMat((MemMat<int> *)local_158,&local_90);
  cv::Mat::~Mat(&local_90.super_Mat);
  local_3b0._0_4_ = uVar4;
  local_3b0._4_4_ = uVar3;
  MemMat<int>::MemMat((MemMat<int> *)local_2e8,(Size *)local_3b0);
  local_4d8._0_4_ = uVar4 + 1 & 0xfffffffe;
  local_4d8._4_4_ = uVar3;
  MemMat<int>::MemMat((MemMat<int> *)local_3b0,(Size *)local_4d8);
  local_518 = accesses;
  MemVector<int>::MemVector(&local_548,(long)(int)uVar3);
  if (0 < (int)uVar3) {
    local_4f8 = local_338;
    local_500 = local_300;
    local_508 = local_3b0._24_8_;
    local_510 = (long *)local_3b0._80_8_;
    uVar18 = 0;
    do {
      iVar27 = 0;
      iVar28 = 0;
      if (0 < (int)uVar4) {
        lVar24 = *local_238;
        lVar25 = *(long *)local_2e8._80_8_;
        lVar19 = *(long *)local_158._80_8_;
        lVar17 = *local_a8;
        uVar21 = 0;
        iVar27 = 0;
        bVar23 = false;
        do {
          piVar13 = (int *)(lVar17 * uVar18 + local_e0 + uVar21 * 4);
          *piVar13 = *piVar13 + 1;
          iVar28 = *(int *)(lVar19 * uVar18 + local_158._24_8_ + uVar21 * 4);
          if (bVar23 != 0 < iVar28) {
            piVar13 = (int *)(*local_300 * uVar18 + local_338 + (long)iVar27 * 4);
            *piVar13 = *piVar13 + 1;
            *(int *)(*(long *)local_3b0._80_8_ * uVar18 + local_3b0._24_8_ + (long)iVar27 * 4) =
                 (int)uVar21;
            iVar27 = iVar27 + 1;
          }
          piVar13 = (int *)(lVar24 * uVar18 + local_270 + uVar21 * 4);
          *piVar13 = *piVar13 + 1;
          *(int *)(lVar25 * uVar18 + local_2e8._24_8_ + uVar21 * 4) = iVar27;
          uVar21 = uVar21 + 1;
          bVar23 = 0 < iVar28;
        } while (uVar4 != uVar21);
        if (iVar28 < 1) {
          iVar28 = 0;
        }
        else {
          piVar13 = (int *)(*local_300 * uVar18 + local_338 + (long)iVar27 * 4);
          *piVar13 = *piVar13 + 1;
          *(uint *)(*(long *)local_3b0._80_8_ * uVar18 + local_3b0._24_8_ + (long)iVar27 * 4) =
               uVar4;
          iVar28 = 1;
        }
      }
      local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar18] =
           local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar18] + 1;
      local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar18] = iVar27 + iVar28;
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar15);
  }
  local_220._0_4_ = uVar4 + 1;
  local_220._4_4_ = uVar3;
  MemMat<int>::MemMat((MemMat<int> *)local_4d8,(Size *)local_220,0);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  UF::MemAlloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  piVar9 = UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  puVar8 = UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  UF::length_ = 1;
  *local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
   ._M_start = *local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
  if (0 < *local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start) {
    lVar24 = 1;
    do {
      uVar12 = UF::length_;
      lVar25 = (long)(int)UF::length_;
      piVar9[lVar25] = piVar9[lVar25] + 1;
      puVar8[lVar25] = uVar12;
      uVar12 = UF::length_;
      UF::length_ = UF::length_ + 1;
      piVar13 = (int *)(local_460 + lVar24 * 4);
      *piVar13 = *piVar13 + 1;
      *(uint *)(local_4d8._24_8_ + lVar24 * 4) = uVar12;
      *local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start =
           *local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + 1;
      lVar24 = lVar24 + 2;
    } while (lVar24 <= *local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
  }
  if (1 < (int)uVar3) {
    uVar18 = 1;
    lVar24 = 0;
    piVar13 = local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar16 = local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar16[uVar18] = piVar16[uVar18] + 1;
      if (0 < piVar13[uVar18]) {
        lVar25 = uVar18 - 1;
        lVar19 = 1;
        do {
          lVar17 = *local_300 * uVar18 + local_338;
          piVar1 = (int *)(lVar17 + -4 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          lVar20 = *(long *)local_3b0._80_8_ * uVar18 + local_3b0._24_8_;
          iVar28 = *(int *)(lVar20 + -4 + lVar19 * 4);
          piVar1 = (int *)(lVar17 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          iVar27 = *(int *)(lVar20 + lVar19 * 4);
          lVar22 = *local_238 * lVar25 + local_270;
          lVar17 = (long)(int)(iVar28 - (uint)(0 < iVar28));
          piVar1 = (int *)(lVar22 + lVar17 * 4);
          *piVar1 = *piVar1 + 1;
          lVar20 = *(long *)local_2e8._80_8_ * lVar25 + local_2e8._24_8_;
          iVar28 = *(int *)(lVar20 + lVar17 * 4);
          lVar17 = (long)(int)(iVar27 - (uint)((int)uVar4 <= iVar27));
          piVar1 = (int *)(lVar22 + lVar17 * 4);
          *piVar1 = *piVar1 + 1;
          uVar11 = UF::length_;
          uVar12 = *(uint *)(lVar20 + lVar17 * 4);
          uVar21 = (long)iVar28 | 1;
          iVar28 = uVar12 + (uVar12 & 1) + -1;
          if (iVar28 < (int)uVar21) {
            lVar17 = (long)(int)UF::length_;
            UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar17] =
                 UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar17] + 1;
            UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar17] = uVar11;
            uVar12 = UF::length_;
            UF::length_ = UF::length_ + 1;
            piVar1 = (int *)(*local_428 * uVar18 + local_460 + lVar19 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_4d8._80_8_ * uVar18 + local_4d8._24_8_ + lVar19 * 4) = uVar12;
          }
          else {
            piVar13 = (int *)(*local_428 * lVar25 + local_460 + uVar21 * 4);
            *piVar13 = *piVar13 + 1;
            uVar12 = UF::MemFindRoot(*(uint *)(*(long *)local_4d8._80_8_ * lVar25 + local_4d8._24_8_
                                              + uVar21 * 4));
            iVar27 = (int)uVar21 + 2;
            if (iVar27 <= iVar28) {
              lVar17 = (long)iVar27;
              do {
                piVar13 = (int *)(*local_428 * lVar24 + local_460 + lVar17 * 4);
                *piVar13 = *piVar13 + 1;
                uVar11 = UF::MemFindRoot(*(uint *)(*(long *)local_4d8._80_8_ * lVar24 +
                                                   local_4d8._24_8_ + lVar17 * 4));
                if ((int)uVar12 < (int)uVar11) {
                  UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar11] =
                       UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar11] + 1;
                  UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[(int)uVar11] = uVar12;
                }
                if ((int)uVar11 < (int)uVar12) {
                  UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar12] =
                       UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar12] + 1;
                  UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[(int)uVar12] = uVar11;
                  uVar12 = uVar11;
                }
                lVar17 = lVar17 + 2;
              } while (lVar17 <= iVar28);
            }
            piVar13 = (int *)(*local_428 * uVar18 + local_460 + lVar19 * 4);
            *piVar13 = *piVar13 + 1;
            *(uint *)(*(long *)local_4d8._80_8_ * uVar18 + local_4d8._24_8_ + lVar19 * 4) = uVar12;
            piVar13 = local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar16 = local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          piVar16[uVar18] = piVar16[uVar18] + 1;
          lVar19 = lVar19 + 2;
        } while (lVar19 <= piVar13[uVar18]);
      }
      uVar18 = uVar18 + 1;
      lVar24 = lVar24 + 1;
    } while (uVar18 != uVar15);
  }
  uVar12 = UF::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar12;
  local_410._0_4_ = uVar4;
  local_410._4_4_ = uVar3;
  MemMat<int>::MemMat((MemMat<int> *)local_220,(Size *)&local_410);
  piVar9 = UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)uVar3) {
    uVar18 = 0;
    do {
      if (0 < (int)uVar4) {
        lVar24 = *local_428;
        lVar25 = *(long *)local_4d8._80_8_;
        lVar19 = *local_170;
        lVar17 = *(long *)local_220._80_8_;
        lVar20 = *(long *)local_2e8._80_8_;
        lVar22 = *local_238;
        uVar21 = 0;
        do {
          piVar13 = (int *)(lVar22 * uVar18 + local_270 + uVar21 * 4);
          *piVar13 = *piVar13 + 1;
          lVar26 = (long)*(int *)(lVar20 * uVar18 + local_2e8._24_8_ + uVar21 * 4);
          piVar13 = (int *)(lVar24 * uVar18 + local_460 + lVar26 * 4);
          *piVar13 = *piVar13 + 1;
          iVar28 = *(int *)(lVar25 * uVar18 + local_4d8._24_8_ + lVar26 * 4);
          piVar9[iVar28] = piVar9[iVar28] + 1;
          uVar3 = puVar8[iVar28];
          piVar13 = (int *)(lVar19 * uVar18 + local_1a8 + uVar21 * 4);
          *piVar13 = *piVar13 + 1;
          *(uint *)(lVar17 * uVar18 + local_220._24_8_ + uVar21 * 4) = uVar3;
          uVar21 = uVar21 + 1;
        } while (uVar4 != uVar21);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar15);
  }
  pauVar14 = (undefined1 (*) [16])operator_new(0x20);
  pvVar10 = local_518;
  pauVar14[1] = (undefined1  [16])0x0;
  *pauVar14 = (undefined1  [16])0x0;
  puVar5 = (local_518->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (local_518->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (local_518->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar14;
  (local_518->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar14 + 2);
  (local_518->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar14 + 2);
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)puVar6 - (long)puVar5);
  }
  local_4e8 = local_f0;
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  cv::sum((_InputArray *)&local_410);
  uVar15 = (ulong)(double)CONCAT44(local_410._4_4_,local_410._0_4_);
  *(pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)CONCAT44(local_410._4_4_,local_410._0_4_) - 9.223372036854776e+18) &
       (long)uVar15 >> 0x3f | uVar15;
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_1b8;
  cv::sum((_InputArray *)&local_410);
  uVar15 = (ulong)(double)CONCAT44(local_410._4_4_,local_410._0_4_);
  puVar5 = (pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5[1] = (long)((double)CONCAT44(local_410._4_4_,local_410._0_4_) - 9.223372036854776e+18) &
              (long)uVar15 >> 0x3f | uVar15;
  if ((long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar15 = 0;
  }
  else {
    lVar24 = (long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar29 = 0.0;
    lVar25 = 0;
    do {
      dVar29 = dVar29 + (double)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar25];
      lVar25 = lVar25 + 1;
    } while (lVar24 + (ulong)(lVar24 == 0) != lVar25);
    uVar15 = (long)(dVar29 - 9.223372036854776e+18) & (long)dVar29 >> 0x3f | (long)dVar29;
  }
  puVar5[2] = uVar15;
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_280;
  cv::sum((_InputArray *)&local_410);
  dVar29 = (double)CONCAT44(local_410._4_4_,local_410._0_4_);
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_348;
  cv::sum((_InputArray *)&local_410);
  if ((long)local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    dVar30 = 0.0;
  }
  else {
    lVar24 = (long)local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar30 = 0.0;
    lVar25 = 0;
    do {
      dVar30 = dVar30 + (double)local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar25];
      lVar25 = lVar25 + 1;
    } while (lVar24 + (ulong)(lVar24 == 0) != lVar25);
  }
  dVar7 = (double)CONCAT44(local_410._4_4_,local_410._0_4_);
  local_4e0 = 0;
  local_4f0 = 0x81010004;
  local_4e8 = local_470;
  cv::sum((_InputArray *)&local_410);
  dVar29 = dVar29 + dVar7 + dVar30 + (double)CONCAT44(local_410._4_4_,local_410._0_4_);
  uVar15 = (ulong)dVar29;
  (pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[3] =
       (long)(dVar29 - 9.223372036854776e+18) & (long)uVar15 >> 0x3f | uVar15;
  MemMat<int>::GetImage(&local_410,(MemMat<int> *)local_220);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     &local_410.super_Mat);
  cv::Mat::~Mat(&local_410.super_Mat);
  cv::Mat::~Mat(local_1b8);
  cv::Mat::~Mat((Mat *)(local_220 + 8));
  cv::Mat::~Mat(local_470);
  cv::Mat::~Mat((Mat *)(local_4d8 + 8));
  if (local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (int *)0x0) {
    operator_delete(local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_548.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_548.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cv::Mat::~Mat(local_348);
  cv::Mat::~Mat((Mat *)(local_3b0 + 8));
  cv::Mat::~Mat(local_280);
  cv::Mat::~Mat((Mat *)(local_2e8 + 8));
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat((Mat *)(local_158 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses) {
        int rows = img_.rows;
        int cols = img_.cols;

        MemMat<int> img(img_);

        // Step 1
        MemMat<int> ER(rows, cols);   // Matrix of relative label (1 label/pixel) 
        MemMat<int> RLC(rows, (cols + 1) & ~1); // MISSING in the paper: RLC requires 2 values/run in row, so width must be next multiple of 2
        MemVector<int> ner(rows); //vector<int> ner(rows); // Number of runs 

        for (int r = 0; r < rows; ++r) {
            int x0;
            int x1 = 0; // Previous value of X
            int f = 0;  // Front detection
            ZOA_MOD0
            int er = 0;
            for (int c = 0; c < cols; ++c)
            {
                x0 = img(r, c) > 0;
                f = x0 ^ x1;
                RLE_MOD1{
                    RLC(r, er) = c ZOA_MOD1;
                    ZOA_MOD2
                        er = er + RLE_MOD2;
                }
                ER(r, c) = er;
                x1 = x0;
            }
            ZOA_MOD3
                RLC(r, er) = cols ZOA_MOD1;
            ZOA_MOD4
                ner[r] = er;
        }